

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O0

String * addrToString(String *__return_storage_ptr__,sockaddr *addr,bool IPv6)

{
  char *pcVar1;
  size_t sVar2;
  size_t len;
  void *input_1;
  sockaddr_in *addr4;
  void *input;
  sockaddr_in6 *addr6;
  bool IPv6_local;
  sockaddr *addr_local;
  String *ip;
  
  String::String(__return_storage_ptr__,0x2e,'\0');
  if (IPv6) {
    pcVar1 = String::operator[](__return_storage_ptr__,0);
    sVar2 = String::size(__return_storage_ptr__);
    inet_ntop(10,addr->sa_data + 6,pcVar1,(socklen_t)sVar2);
  }
  else {
    pcVar1 = String::operator[](__return_storage_ptr__,0);
    sVar2 = String::size(__return_storage_ptr__);
    inet_ntop(2,addr->sa_data + 2,pcVar1,(socklen_t)sVar2);
  }
  pcVar1 = String::constData(__return_storage_ptr__);
  len = strlen(pcVar1);
  String::resize(__return_storage_ptr__,len);
  return __return_storage_ptr__;
}

Assistant:

static String addrToString(const sockaddr* addr, bool IPv6)
{
    String ip(INET6_ADDRSTRLEN, '\0');
    if (IPv6) {
        const sockaddr_in6* addr6 = reinterpret_cast<const sockaddr_in6*>(addr);
#ifdef _WIN32
        // stupid windows declares inet_ntop wrong: 3rd argument is PVOID,
        // which is not const -- we have to cast the const away :(
        PVOID input = const_cast<PVOID>(static_cast<const void*>(&addr6->sin6_addr));
#else
        const void *input = &addr6->sin6_addr;
#endif
        inet_ntop(AF_INET6, input, &ip[0], ip.size());
    } else {
        const sockaddr_in* addr4 = reinterpret_cast<const sockaddr_in*>(addr);
#ifdef _WIN32
        // stupid windows declares inet_ntop wrong: 3rd argument is PVOID,
        // which is not const -- we have to cast the const away :(
        PVOID input = const_cast<PVOID>(static_cast<const void*>(&addr4->sin_addr));
#else
        const void *input = &addr4->sin_addr;
#endif
        inet_ntop(AF_INET, input, &ip[0], ip.size());
    }
    ip.resize(strlen(ip.constData()));
    return ip;
}